

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_await.c
# Opt level: O0

int mpt_connection_await(mpt_connection *con,_func_int_void_ptr_mpt_message_ptr *ctl,void *udata)

{
  byte bVar1;
  undefined8 *puVar2;
  size_t max;
  mpt_command *cmd;
  void *udata_local;
  _func_int_void_ptr_mpt_message_ptr *ctl_local;
  mpt_connection *con_local;
  
  if (((con->out).sock._id < 0) && ((con->out).buf._buf == (mpt_buffer *)0x0)) {
    con_local._4_4_ = -1;
  }
  else if ((con->cid == 0) && (((con->out).state & 0x10) == 0)) {
    bVar1 = (con->out)._idlen;
    if (4 < bVar1) {
      bVar1 = 4;
    }
    puVar2 = (undefined8 *)mpt_command_reserve(&con->_wait,bVar1);
    if (puVar2 == (undefined8 *)0x0) {
      con_local._4_4_ = -2;
    }
    else {
      (con->out).state = (con->out).state | 0x40;
      con->cid = (uint32_t)*puVar2;
      if (ctl != (_func_int_void_ptr_mpt_message_ptr *)0x0) {
        puVar2[1] = ctl;
        puVar2[2] = udata;
      }
      con_local._4_4_ = (int)(((long)puVar2 + (0x18 - (long)((con->_wait)._buf + 1))) / 0x18);
    }
  }
  else {
    con_local._4_4_ = -4;
  }
  return con_local._4_4_;
}

Assistant:

extern int mpt_connection_await(MPT_STRUCT(connection) *con, int (*ctl)(void *, const MPT_STRUCT(message) *), void *udata)
{
	MPT_STRUCT(command) *cmd;
	size_t max;
	
	/* no socket or stream open */
	if (!MPT_socket_active(&con->out.sock) && !(con->out.buf._buf)) {
		return MPT_ERROR(BadArgument);
	}
	/* message in progress */
	if (con->cid || (con->out.state & MPT_OUTFLAG(Active))) {
		return MPT_ERROR(BadOperation);
	}
	if ((max = con->out._idlen) > sizeof(con->cid)) {
		max = sizeof(con->cid);
	}
	if (!(cmd = mpt_command_reserve(&con->_wait, max))) {
		return MPT_ERROR(BadValue);
	}
	/* make next message non-local */
	con->out.state |= MPT_OUTFLAG(Remote);
	con->cid = cmd->id;
	
	if (ctl) {
		cmd->cmd = (int (*)()) ctl;
		cmd->arg = udata;
	}
	return 1 + cmd - ((MPT_STRUCT(command) *) (con->_wait._buf + 1));
}